

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter.cpp
# Opt level: O2

ListInfo __thiscall QTextMarkdownWriter::listInfo(QTextMarkdownWriter *this,QTextList *list)

{
  bool bVar1;
  ListInfo LVar2;
  int iVar3;
  QDebug *pQVar4;
  QTextList *pQVar5;
  QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QTextList *local_98;
  ListInfo local_89;
  undefined1 local_88 [20];
  undefined4 local_74;
  char *local_70;
  undefined1 local_68 [16];
  QTextDocumentPrivate *local_58;
  undefined1 *puStack_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_listInfo;
  local_98 = list;
  bVar1 = QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::contains(this_00,&local_98);
  if (bVar1) {
    local_88._0_4_ = local_88._0_4_ & 0xffffff00;
    LVar2 = QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::value
                      (this_00,&local_98,(ListInfo *)local_88);
  }
  else {
    local_89.loose = false;
    iVar3 = QTextList::count(local_98);
    if (1 < iVar3) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextList::item((QTextList *)local_48,(int)local_98);
      pQVar5 = local_98;
      local_58 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTextList::count(local_98);
      QTextList::item((QTextList *)&local_58,(int)pQVar5);
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::next((QTextBlock *)local_68);
      while (bVar1 = QTextBlock::isValid((QTextBlock *)local_68), bVar1) {
        if ((QTextDocumentPrivate *)local_68._0_8_ == local_58) {
          if (local_68._8_4_ == (int)puStack_50) break;
        }
        lcMDW();
        if (((byte)lcMDW::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
          local_88._0_4_ = 2;
          local_88._4_4_ = 0;
          local_88._8_4_ = 0;
          local_88._12_8_ = 0;
          local_74 = 0;
          local_70 = lcMDW::category.name;
          QMessageLogger::debug();
          pQVar4 = QDebug::operator<<(&local_b8,"next block in list");
          local_b0.stream = pQVar4->stream;
          (local_b0.stream)->ref = (local_b0.stream)->ref + 1;
          ::operator<<((QDebug *)&local_e8,(QObject *)&local_b0);
          QTextBlock::text((QString *)&local_d0,(QTextBlock *)local_68);
          pQVar4 = QDebug::operator<<((QDebug *)&local_e8,(QString *)&local_d0);
          pQVar4 = QDebug::operator<<(pQVar4,"part of list?");
          local_a8.stream = pQVar4->stream;
          (local_a8.stream)->ref = (local_a8.stream)->ref + 1;
          QTextBlock::textList((QTextBlock *)local_68);
          ::operator<<((QDebug *)&local_a0,(QObject *)&local_a8);
          QDebug::~QDebug(&local_a0);
          QDebug::~QDebug(&local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
          QDebug::~QDebug((QDebug *)&local_e8);
          QDebug::~QDebug(&local_b0);
          QDebug::~QDebug(&local_b8);
        }
        pQVar5 = QTextBlock::textList((QTextBlock *)local_68);
        if (pQVar5 == (QTextList *)0x0) {
          lcMDW();
          if (((byte)lcMDW::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
            local_88._0_4_ = 2;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_8_ = 0;
            local_74 = 0;
            local_70 = lcMDW::category.name;
            QMessageLogger::debug();
            pQVar4 = QDebug::operator<<(&local_b8,"decided list beginning with");
            QTextBlock::text((QString *)&local_d0,(QTextBlock *)local_48);
            pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_d0);
            pQVar4 = QDebug::operator<<(pQVar4,"is loose after");
            QTextBlock::text((QString *)&local_e8,(QTextBlock *)local_68);
            QDebug::operator<<(pQVar4,(QString *)&local_e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
            QDebug::~QDebug(&local_b8);
          }
          local_89.loose = true;
          break;
        }
        QTextBlock::next((QTextBlock *)local_88);
        local_68._0_8_ = CONCAT44(local_88._4_4_,local_88._0_4_);
        local_68._8_4_ = local_88._8_4_;
      }
    }
    QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::insert(this_00,&local_98,&local_89);
    LVar2.loose = local_89.loose;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (ListInfo)LVar2.loose;
}

Assistant:

QTextMarkdownWriter::ListInfo QTextMarkdownWriter::listInfo(QTextList *list)
{
    if (!m_listInfo.contains(list)) {
        // decide whether this list is loose or tight
        ListInfo info;
        info.loose = false;
        if (list->count() > 1) {
            QTextBlock first = list->item(0);
            QTextBlock last = list->item(list->count() - 1);
            QTextBlock next = first.next();
            while (next.isValid()) {
                if (next == last)
                    break;
                qCDebug(lcMDW) << "next block in list" << list << next.text() << "part of list?" << next.textList();
                if (!next.textList()) {
                    // If we find a continuation paragraph, this list is "loose"
                    // because it will need a blank line to separate that paragraph.
                    qCDebug(lcMDW) << "decided list beginning with" << first.text() << "is loose after" << next.text();
                    info.loose = true;
                    break;
                }
                next = next.next();
            }
        }
        m_listInfo.insert(list, info);
        return info;
    }
    return m_listInfo.value(list);
}